

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O2

int knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,char *hostp,int port,char *key,size_t keylen,
                   int typemask,libssh2_knownhost **ext)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  known_host *node;
  size_t datalen;
  libssh2_knownhost *plVar5;
  char *pcVar6;
  known_host *node_00;
  int host_key_type;
  LIBSSH2_SESSION *session;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  EVP_MAC_CTX *ctx;
  char *local_198;
  char *keyalloc;
  uint local_184;
  LIBSSH2_KNOWNHOSTS *local_180;
  list_head *local_178;
  char *local_170;
  uchar hash [20];
  char hostbuff [270];
  
  uVar8 = typemask & 0xffff;
  keyalloc = (char *)0x0;
  if (uVar8 == 2) {
    return 1;
  }
  pcVar6 = hostp;
  local_198 = key;
  local_170 = hostp;
  if (port < 0) {
LAB_00114f2b:
    if (((uint)typemask >> 0x11 & 1) == 0) {
      sVar4 = _libssh2_base64_encode(hosts->session,local_198,keylen,&keyalloc);
      if (sVar4 == 0) {
        session = hosts->session;
        pcVar6 = "Unable to allocate memory for base64-encoded key";
        iVar3 = -6;
        goto LAB_0011513a;
      }
      local_198 = keyalloc;
    }
    uVar7 = (ulong)((uint)port >> 0x1f);
    local_178 = &hosts->head;
    uVar2 = typemask & 0x3c0000;
    node_00 = (known_host *)0x0;
    local_180 = hosts;
    do {
      local_184 = (uint)uVar7;
      for (node = (known_host *)_libssh2_list_first(local_178); node != (known_host *)0x0;
          node = (known_host *)_libssh2_list_next(&node->node)) {
        sVar1 = (short)node->typemask;
        if (sVar1 == 3) {
          if (uVar8 == 3) {
LAB_0011505c:
            iVar3 = strcmp(pcVar6,node->name);
LAB_00115068:
            bVar9 = iVar3 == 0;
LAB_00115071:
            if ((bVar9) &&
               ((uVar2 == 0 || ((uVar2 != 0x3c0000 && (uVar2 == (node->typemask & 0x3c0000U))))))) {
              iVar3 = strcmp(local_198,node->key);
              if (iVar3 == 0) {
                iVar3 = 0;
                node_00 = node;
                goto LAB_001150f1;
              }
              if (node_00 == (known_host *)0x0) {
                node_00 = node;
              }
            }
          }
        }
        else if (sVar1 == 2) {
          if (uVar8 == 1) {
            iVar3 = _libssh2_hmac_ctx_init(&ctx);
            bVar9 = false;
            if (((iVar3 != 0) && (node->name_len == 0x14)) &&
               (iVar3 = _libssh2_hmac_sha1_init(&ctx,node->salt,node->salt_len), iVar3 != 0)) {
              datalen = strlen(pcVar6);
              iVar3 = _libssh2_hmac_update(&ctx,pcVar6,datalen);
              if ((iVar3 != 0) && (iVar3 = _libssh2_hmac_final(&ctx,hash), iVar3 != 0)) {
                _libssh2_hmac_cleanup(&ctx);
                iVar3 = bcmp(hash,node->name,0x14);
                goto LAB_00115068;
              }
              _libssh2_hmac_cleanup(&ctx);
            }
            goto LAB_00115071;
          }
        }
        else if ((sVar1 == 1) && (uVar8 == 1)) goto LAB_0011505c;
      }
      uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
      pcVar6 = local_170;
    } while ((local_184 & 1) == 0);
    if (node_00 == (known_host *)0x0) {
      iVar3 = 2;
    }
    else {
      iVar3 = 1;
LAB_001150f1:
      if (ext != (libssh2_knownhost **)0x0) {
        plVar5 = knownhost_to_external(node_00);
        *ext = plVar5;
      }
    }
    if (keyalloc != (char *)0x0) {
      (*local_180->session->free)(keyalloc,&local_180->session->abstract);
    }
  }
  else {
    pcVar6 = hostbuff;
    uVar2 = snprintf(pcVar6,0x10e,"[%s]:%d",hostp);
    if (uVar2 < 0x10e) goto LAB_00114f2b;
    session = hosts->session;
    pcVar6 = "Known-host write buffer too small";
    iVar3 = -0x26;
LAB_0011513a:
    _libssh2_error(session,iVar3,pcVar6);
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

static int
knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,
                const char *hostp, int port,
                const char *key, size_t keylen,
                int typemask,
                struct libssh2_knownhost **ext)
{
    struct known_host *node;
    struct known_host *badkey = NULL;
    int type = typemask & LIBSSH2_KNOWNHOST_TYPE_MASK;
    char *keyalloc = NULL;
    int rc = LIBSSH2_KNOWNHOST_CHECK_NOTFOUND;
    char hostbuff[270]; /* most host names can't be longer than like 256 */
    const char *host;
    int numcheck; /* number of host combos to check */
    int match = 0;

    if(type == LIBSSH2_KNOWNHOST_TYPE_SHA1)
        /* we can't work with a sha1 as given input */
        return LIBSSH2_KNOWNHOST_CHECK_MISMATCH;

    /* if a port number is given, check for a '[host]:port' first before the
       plain 'host' */
    if(port >= 0) {
        int len = snprintf(hostbuff, sizeof(hostbuff), "[%s]:%d", hostp, port);
        if(len < 0 || len >= (int)sizeof(hostbuff)) {
            _libssh2_error(hosts->session,
                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                           "Known-host write buffer too small");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }
        host = hostbuff;
        numcheck = 2; /* check both combos, start with this */
    }
    else {
        host = hostp;
        numcheck = 1; /* only check this host version */
    }

    if(!(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64)) {
        /* we got a raw key input, convert it to base64 for the checks below */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &keyalloc);
        if(!nlen) {
            _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for base64-encoded "
                           "key");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }

        /* make the key point to this */
        key = keyalloc;
    }

    do {
        node = _libssh2_list_first(&hosts->head);
        while(node) {
            switch(node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) {
            case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
                if(type == LIBSSH2_KNOWNHOST_TYPE_CUSTOM)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_SHA1:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN) {
                    /* when we have the sha1 version stored, we can use a
                       plain input to produce a hash to compare with the
                       stored hash.
                    */
                    unsigned char hash[SHA_DIGEST_LENGTH];
                    libssh2_hmac_ctx ctx;
                    if(!_libssh2_hmac_ctx_init(&ctx))
                        break;

                    if(SHA_DIGEST_LENGTH != node->name_len) {
                        /* the name hash length must be the sha1 size or
                           we can't match it */
                        break;
                    }
                    if(!_libssh2_hmac_sha1_init(&ctx,
                                                node->salt, node->salt_len))
                        break;
                    if(!_libssh2_hmac_update(&ctx, host, strlen(host)) ||
                       !_libssh2_hmac_final(&ctx, hash)) {
                        _libssh2_hmac_cleanup(&ctx);
                        break;
                    }
                    _libssh2_hmac_cleanup(&ctx);

                    if(!memcmp(hash, node->name, SHA_DIGEST_LENGTH))
                        /* this is a node we're interested in */
                        match = 1;
                }
                break;
            default: /* unsupported type */
                break;
            }
            if(match) {
                int host_key_type = typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                int known_key_type =
                    node->typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                /* match on key type as follows:
                   - never match on an unknown key type
                   - if key_type is set to zero, ignore it an match always
                   - otherwise match when both key types are equal
                */
                if(host_key_type != LIBSSH2_KNOWNHOST_KEY_UNKNOWN &&
                     (host_key_type == 0 ||
                      host_key_type == known_key_type)) {
                    /* host name and key type match, now compare the keys */
                    if(!strcmp(key, node->key)) {
                        /* they match! */
                        if(ext)
                            *ext = knownhost_to_external(node);
                        badkey = NULL;
                        rc = LIBSSH2_KNOWNHOST_CHECK_MATCH;
                        break;
                    }
                    else {
                        /* remember the first node that had a host match but a
                           failed key match since we continue our search from
                           here */
                        if(!badkey)
                            badkey = node;
                    }
                }
                match = 0; /* don't count this as a match anymore */
            }
            node = _libssh2_list_next(&node->node);
        }
        host = hostp;
    } while(!match && --numcheck);

    if(badkey) {
        /* key mismatch */
        if(ext)
            *ext = knownhost_to_external(badkey);
        rc = LIBSSH2_KNOWNHOST_CHECK_MISMATCH;
    }

    if(keyalloc)
        LIBSSH2_FREE(hosts->session, keyalloc);

    return rc;
}